

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_trace_striped_sse2_128_16.c
# Opt level: O3

parasail_result_t *
parasail_nw_trace_striped_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ulong uVar1;
  uint uVar2;
  undefined8 *puVar3;
  ushort *puVar4;
  short *psVar5;
  ushort *puVar6;
  void *pvVar7;
  parasail_matrix_t *ppVar8;
  int *piVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  short sVar33;
  parasail_result_t *ppVar34;
  __m128i *palVar35;
  __m128i *ptr;
  __m128i *ptr_00;
  __m128i *palVar36;
  __m128i *ptr_01;
  __m128i *ptr_02;
  int16_t *ptr_03;
  int iVar37;
  long lVar38;
  uint uVar39;
  ulong uVar40;
  uint uVar41;
  int iVar42;
  int iVar43;
  long lVar44;
  ulong uVar45;
  long lVar46;
  long lVar47;
  undefined2 uVar48;
  int iVar49;
  long lVar50;
  __m128i *ptr_04;
  ulong uVar51;
  uint uVar52;
  uint uVar53;
  undefined4 uVar54;
  undefined4 uVar55;
  ulong uVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  ulong uVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  ushort uVar67;
  ushort uVar72;
  ushort uVar73;
  ushort uVar74;
  ushort uVar75;
  ushort uVar76;
  ushort uVar77;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  ushort uVar78;
  undefined1 auVar71 [16];
  ushort uVar79;
  int iVar80;
  ushort uVar82;
  ushort uVar83;
  int iVar84;
  ushort uVar85;
  ushort uVar86;
  int iVar87;
  ushort uVar88;
  ushort uVar89;
  undefined1 auVar81 [16];
  int iVar90;
  ushort uVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  ushort uVar94;
  short sVar96;
  ushort uVar98;
  short sVar100;
  ushort uVar101;
  short sVar103;
  ushort uVar104;
  short sVar106;
  ushort uVar107;
  short sVar109;
  ushort uVar110;
  short sVar112;
  ushort uVar113;
  short sVar115;
  ushort uVar116;
  short sVar118;
  undefined1 auVar97 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  ushort uVar133;
  short sVar134;
  int iVar135;
  short sVar140;
  ushort uVar141;
  short sVar142;
  ushort uVar143;
  short sVar144;
  int iVar145;
  short sVar146;
  short sVar147;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  ushort uVar139;
  undefined1 auVar138 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  __m128i_16_t e;
  __m128i_16_t h;
  ushort local_104;
  __m128i *local_f0;
  ushort local_98;
  ushort uStack_96;
  ushort local_88;
  ushort uStack_86;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  ushort uVar95;
  ushort uVar99;
  ushort uVar102;
  ushort uVar105;
  ushort uVar108;
  ushort uVar111;
  ushort uVar114;
  ushort uVar117;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_trace_striped_profile_sse2_128_16_cold_8();
  }
  else {
    pvVar7 = (profile->profile16).score;
    if (pvVar7 == (void *)0x0) {
      parasail_nw_trace_striped_profile_sse2_128_16_cold_7();
    }
    else {
      ppVar8 = profile->matrix;
      if (ppVar8 == (parasail_matrix_t *)0x0) {
        parasail_nw_trace_striped_profile_sse2_128_16_cold_6();
      }
      else {
        uVar53 = profile->s1Len;
        if ((int)uVar53 < 1) {
          parasail_nw_trace_striped_profile_sse2_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_trace_striped_profile_sse2_128_16_cold_4();
        }
        else {
          uVar61 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_nw_trace_striped_profile_sse2_128_16_cold_3();
          }
          else if (open < 0) {
            parasail_nw_trace_striped_profile_sse2_128_16_cold_2();
          }
          else if (gap < 0) {
            parasail_nw_trace_striped_profile_sse2_128_16_cold_1();
          }
          else {
            uVar39 = uVar53 - 1;
            uVar51 = (ulong)uVar53 + 7 >> 3;
            uVar52 = -open;
            uVar53 = ppVar8->min;
            iVar43 = -uVar53;
            if (uVar53 != uVar52 && SBORROW4(uVar53,uVar52) == (int)(uVar53 + open) < 0) {
              iVar43 = open;
            }
            iVar37 = ppVar8->max;
            ppVar34 = parasail_result_new_trace((int)uVar51,s2Len,0x10,0x10);
            if (ppVar34 != (parasail_result_t *)0x0) {
              iVar49 = (int)(uVar39 / uVar51);
              ppVar34->flag = ppVar34->flag | 0x8280801;
              palVar35 = parasail_memalign___m128i(0x10,uVar51);
              ptr = parasail_memalign___m128i(0x10,uVar51);
              ptr_00 = parasail_memalign___m128i(0x10,uVar51);
              palVar36 = parasail_memalign___m128i(0x10,uVar51);
              ptr_01 = parasail_memalign___m128i(0x10,uVar51);
              ptr_02 = parasail_memalign___m128i(0x10,uVar51);
              uVar41 = s2Len + 1;
              ptr_03 = parasail_memalign_int16_t(0x10,(ulong)uVar41);
              auVar62._0_4_ = -(uint)((int)ptr_00 == 0);
              auVar62._4_4_ = -(uint)((int)((ulong)ptr_00 >> 0x20) == 0);
              auVar62._8_4_ = -(uint)((int)palVar36 == 0);
              auVar62._12_4_ = -(uint)((int)((ulong)palVar36 >> 0x20) == 0);
              auVar57._0_4_ = -(uint)((int)((ulong)palVar35 >> 0x20) == 0 && (int)palVar35 == 0);
              auVar57._4_4_ = -(uint)((int)ptr == 0 && (int)((ulong)ptr >> 0x20) == 0);
              auVar57._8_4_ = auVar62._0_4_ & auVar62._4_4_;
              auVar57._12_4_ = auVar62._8_4_ & auVar62._12_4_;
              iVar42 = movmskps(uVar41,auVar57);
              if (((ptr_02 != (__m128i *)0x0 && ptr_01 != (__m128i *)0x0) &&
                  ptr_03 != (int16_t *)0x0) && iVar42 == 0) {
                iVar42 = s2Len + -1;
                auVar57 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
                uVar54 = auVar57._0_4_;
                auVar66._4_4_ = uVar54;
                auVar66._0_4_ = uVar54;
                auVar66._8_4_ = uVar54;
                auVar66._12_4_ = uVar54;
                auVar57 = pshuflw(auVar62,ZEXT416((uint)gap),0);
                uVar54 = auVar57._0_4_;
                uVar41 = iVar43 - 0x7fff;
                auVar57 = pshuflw(ZEXT416(uVar41),ZEXT416(uVar41),0);
                local_88 = auVar57._0_2_;
                uStack_86 = auVar57._2_2_;
                auVar62 = ZEXT416(CONCAT22((short)(uVar53 >> 0x10),0x7ffe - (short)iVar37));
                auVar62 = pshuflw(auVar62,auVar62,0);
                lVar38 = (long)(int)uVar52;
                uVar40 = 0;
                do {
                  lVar46 = 0;
                  lVar44 = lVar38;
                  do {
                    uVar48 = 0x8000;
                    if (-0x8000 < lVar44) {
                      uVar48 = (undefined2)lVar44;
                    }
                    *(undefined2 *)((long)&local_48 + lVar46 * 2) = uVar48;
                    lVar50 = lVar44 - (ulong)(uint)open;
                    if (lVar50 < -0x7fff) {
                      lVar50 = -0x8000;
                    }
                    *(short *)((long)&local_58 + lVar46 * 2) = (short)lVar50;
                    lVar46 = lVar46 + 1;
                    lVar44 = lVar44 - uVar51 * (uint)gap;
                  } while (lVar46 != 8);
                  palVar35[uVar40][0] = local_48;
                  palVar35[uVar40][1] = lStack_40;
                  ptr_00[uVar40][0] = local_58;
                  ptr_00[uVar40][1] = lStack_50;
                  palVar36[uVar40][0] = local_58;
                  palVar36[uVar40][1] = lStack_50;
                  uVar40 = uVar40 + 1;
                  lVar38 = lVar38 - (ulong)(uint)gap;
                } while (uVar40 != uVar51);
                *ptr_03 = 0;
                auVar60 = _DAT_00904aa0;
                auVar137 = _DAT_00903aa0;
                lVar38 = uVar61 - 1;
                auVar81._8_4_ = (int)lVar38;
                auVar81._0_8_ = lVar38;
                auVar81._12_4_ = (int)((ulong)lVar38 >> 0x20);
                iVar37 = -gap;
                iVar43 = gap * 2;
                uVar40 = 0;
                auVar81 = auVar81 ^ _DAT_00903aa0;
                auVar148._8_4_ = 0xffffffff;
                auVar148._0_8_ = 0xffffffffffffffff;
                auVar148._12_4_ = 0xffffffff;
                uVar53 = uVar52;
                do {
                  uVar55 = (undefined4)uVar40;
                  auVar58._8_4_ = uVar55;
                  auVar58._0_8_ = uVar40;
                  auVar58._12_4_ = (int)(uVar40 >> 0x20);
                  auVar119 = (auVar58 | _DAT_00903a90) ^ auVar137;
                  iVar80 = auVar81._0_4_;
                  iVar135 = -(uint)(iVar80 < auVar119._0_4_);
                  iVar84 = auVar81._4_4_;
                  auVar124._4_4_ = -(uint)(iVar84 < auVar119._4_4_);
                  iVar87 = auVar81._8_4_;
                  iVar145 = -(uint)(iVar87 < auVar119._8_4_);
                  iVar90 = auVar81._12_4_;
                  auVar124._12_4_ = -(uint)(iVar90 < auVar119._12_4_);
                  auVar129._4_4_ = iVar135;
                  auVar129._0_4_ = iVar135;
                  auVar129._8_4_ = iVar145;
                  auVar129._12_4_ = iVar145;
                  auVar150 = pshuflw(in_XMM15,auVar129,0xe8);
                  auVar151._0_4_ = -(uint)(auVar119._0_4_ == iVar80);
                  auVar151._4_4_ = -(uint)(auVar119._4_4_ == iVar84);
                  auVar151._8_4_ = -(uint)(auVar119._8_4_ == iVar87);
                  auVar151._12_4_ = -(uint)(auVar119._12_4_ == iVar90);
                  auVar92._4_4_ = auVar151._4_4_;
                  auVar92._0_4_ = auVar151._4_4_;
                  auVar92._8_4_ = auVar151._12_4_;
                  auVar92._12_4_ = auVar151._12_4_;
                  auVar119 = pshuflw(auVar151,auVar92,0xe8);
                  auVar124._0_4_ = auVar124._4_4_;
                  auVar124._8_4_ = auVar124._12_4_;
                  auVar151 = pshuflw(auVar150,auVar124,0xe8);
                  auVar119 = (auVar151 | auVar119 & auVar150) ^ auVar148;
                  auVar151 = packssdw(auVar119,auVar119);
                  uVar2 = gap * -3 + uVar53;
                  auVar119._0_4_ = -(uint)(auVar60._0_4_ < (int)uVar53);
                  auVar119._4_4_ = -(uint)(auVar60._4_4_ < iVar37 - open);
                  auVar119._8_4_ = -(uint)(auVar60._8_4_ < (int)(uVar52 - iVar43));
                  auVar119._12_4_ = -(uint)(auVar60._12_4_ < (int)uVar2);
                  auVar150._0_4_ = uVar53 & auVar119._0_4_;
                  auVar150._4_4_ = iVar37 - open & auVar119._4_4_;
                  auVar150._8_4_ = uVar52 - iVar43 & auVar119._8_4_;
                  auVar150._12_4_ = uVar2 & auVar119._12_4_;
                  auVar150 = ~auVar119 & auVar60 | auVar150;
                  if ((auVar151 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    ptr_03[uVar40 + 1] = auVar150._0_2_;
                  }
                  auVar124 = auVar92 & auVar129 | auVar124;
                  auVar119 = packssdw(auVar124,auVar124);
                  auVar119 = packssdw(auVar119 ^ auVar148,auVar119 ^ auVar148);
                  if ((auVar119._0_4_ >> 0x10 & 1) != 0) {
                    ptr_03[uVar40 + 2] = auVar150._4_2_;
                  }
                  auVar119 = (auVar58 | _DAT_00903a80) ^ auVar137;
                  auVar120._0_4_ = -(uint)(iVar80 < auVar119._0_4_);
                  auVar120._4_4_ = -(uint)(iVar84 < auVar119._4_4_);
                  auVar120._8_4_ = -(uint)(iVar87 < auVar119._8_4_);
                  auVar120._12_4_ = -(uint)(iVar90 < auVar119._12_4_);
                  auVar125._4_4_ = auVar120._0_4_;
                  auVar125._0_4_ = auVar120._0_4_;
                  auVar125._8_4_ = auVar120._8_4_;
                  auVar125._12_4_ = auVar120._8_4_;
                  iVar135 = -(uint)(auVar119._4_4_ == iVar84);
                  iVar145 = -(uint)(auVar119._12_4_ == iVar90);
                  auVar130._4_4_ = iVar135;
                  auVar130._0_4_ = iVar135;
                  auVar130._8_4_ = iVar145;
                  auVar130._12_4_ = iVar145;
                  auVar136._4_4_ = auVar120._4_4_;
                  auVar136._0_4_ = auVar120._4_4_;
                  auVar136._8_4_ = auVar120._12_4_;
                  auVar136._12_4_ = auVar120._12_4_;
                  auVar119 = auVar130 & auVar125 | auVar136;
                  auVar119 = packssdw(auVar119,auVar119);
                  auVar119 = packssdw(auVar119 ^ auVar148,auVar119 ^ auVar148);
                  if ((auVar119 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    ptr_03[uVar40 + 3] = auVar150._8_2_;
                  }
                  auVar119 = pshufhw(auVar119,auVar125,0x84);
                  auVar124 = pshufhw(auVar120,auVar130,0x84);
                  auVar92 = pshufhw(auVar119,auVar136,0x84);
                  auVar119 = (auVar92 | auVar124 & auVar119) ^ auVar148;
                  auVar119 = packssdw(auVar119,auVar119);
                  if ((auVar119 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    ptr_03[uVar40 + 4] = auVar150._12_2_;
                  }
                  auVar68._4_4_ = uVar55;
                  auVar68._0_4_ = uVar55;
                  auVar68._8_4_ = uVar55;
                  auVar68._12_4_ = uVar55;
                  auVar68 = auVar68 | _DAT_00904a90;
                  auVar121._4_4_ = gap;
                  auVar121._0_4_ = gap;
                  auVar121._8_4_ = gap;
                  auVar121._12_4_ = gap;
                  auVar93._0_4_ = uVar52 - auVar68._0_4_ * gap;
                  auVar93._4_4_ = uVar52 - gap * auVar68._4_4_;
                  auVar93._8_4_ = uVar52 - (int)((auVar68._8_8_ & 0xffffffff) * (ulong)(uint)gap);
                  auVar93._12_4_ =
                       uVar52 - (int)((auVar121._8_8_ & 0xffffffff) * (ulong)auVar68._12_4_);
                  auVar122._0_4_ = -(uint)(auVar60._0_4_ < auVar93._0_4_);
                  auVar122._4_4_ = -(uint)(auVar60._4_4_ < auVar93._4_4_);
                  auVar122._8_4_ = -(uint)(auVar60._8_4_ < auVar93._8_4_);
                  auVar122._12_4_ = -(uint)(auVar60._12_4_ < auVar93._12_4_);
                  auVar150 = ~auVar122 & auVar60 | auVar93 & auVar122;
                  auVar92 = (auVar58 | _DAT_00903ad0) ^ auVar137;
                  auVar69._0_4_ = -(uint)(iVar80 < auVar92._0_4_);
                  auVar69._4_4_ = -(uint)(iVar84 < auVar92._4_4_);
                  auVar69._8_4_ = -(uint)(iVar87 < auVar92._8_4_);
                  auVar69._12_4_ = -(uint)(iVar90 < auVar92._12_4_);
                  auVar131._4_4_ = auVar69._0_4_;
                  auVar131._0_4_ = auVar69._0_4_;
                  auVar131._8_4_ = auVar69._8_4_;
                  auVar131._12_4_ = auVar69._8_4_;
                  auVar119 = pshuflw(auVar93 & auVar122,auVar131,0xe8);
                  auVar126._4_4_ = -(uint)(auVar92._4_4_ == iVar84);
                  auVar126._12_4_ = -(uint)(auVar92._12_4_ == iVar90);
                  auVar126._0_4_ = auVar126._4_4_;
                  auVar126._8_4_ = auVar126._12_4_;
                  in_XMM15 = pshuflw(auVar151,auVar126,0xe8);
                  in_XMM15 = in_XMM15 & auVar119;
                  auVar127._4_4_ = auVar69._4_4_;
                  auVar127._0_4_ = auVar69._4_4_;
                  auVar127._8_4_ = auVar69._12_4_;
                  auVar127._12_4_ = auVar69._12_4_;
                  auVar119 = pshuflw(auVar69,auVar127,0xe8);
                  auVar119 = (auVar119 | in_XMM15) ^ auVar148;
                  auVar119 = packssdw(auVar119,auVar119);
                  if ((auVar119 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    ptr_03[uVar40 + 5] = auVar150._0_2_;
                  }
                  auVar127 = auVar126 & auVar131 | auVar127;
                  auVar151 = packssdw(auVar127,auVar127);
                  auVar119 = packssdw(auVar119,auVar151 ^ auVar148);
                  if ((auVar119 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                    ptr_03[uVar40 + 6] = auVar150._4_2_;
                  }
                  auVar58 = (auVar58 | _DAT_00903ac0) ^ auVar137;
                  auVar70._0_4_ = -(uint)(iVar80 < auVar58._0_4_);
                  auVar70._4_4_ = -(uint)(iVar84 < auVar58._4_4_);
                  auVar70._8_4_ = -(uint)(iVar87 < auVar58._8_4_);
                  auVar70._12_4_ = -(uint)(iVar90 < auVar58._12_4_);
                  auVar128._4_4_ = auVar70._0_4_;
                  auVar128._0_4_ = auVar70._0_4_;
                  auVar128._8_4_ = auVar70._8_4_;
                  auVar128._12_4_ = auVar70._8_4_;
                  auVar59._4_4_ = -(uint)(auVar58._4_4_ == iVar84);
                  auVar59._12_4_ = -(uint)(auVar58._12_4_ == iVar90);
                  auVar59._0_4_ = auVar59._4_4_;
                  auVar59._8_4_ = auVar59._12_4_;
                  auVar132._4_4_ = auVar70._4_4_;
                  auVar132._0_4_ = auVar70._4_4_;
                  auVar132._8_4_ = auVar70._12_4_;
                  auVar132._12_4_ = auVar70._12_4_;
                  auVar58 = packssdw(auVar70,auVar59 & auVar128 | auVar132);
                  auVar58 = packssdw(auVar58 ^ auVar148,auVar58 ^ auVar148);
                  if ((auVar58 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    ptr_03[uVar40 + 7] = auVar150._8_2_;
                  }
                  auVar119 = pshufhw(auVar58,auVar128,0x84);
                  auVar58 = pshufhw(auVar59,auVar59,0x84);
                  auVar151 = pshufhw(auVar119,auVar132,0x84);
                  auVar58 = packssdw(auVar58 & auVar119,(auVar151 | auVar58 & auVar119) ^ auVar148);
                  if ((auVar58 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    ptr_03[uVar40 + 8] = auVar150._12_2_;
                  }
                  uVar40 = uVar40 + 8;
                  iVar37 = iVar37 + gap * -8;
                  uVar53 = uVar53 + gap * -8;
                  iVar43 = iVar43 + gap * 8;
                } while ((s2Len + 7U & 0xfffffff8) != uVar40);
                lVar44 = uVar51 * 0x10;
                lVar38 = 0;
                do {
                  puVar3 = (undefined8 *)((long)((ppVar34->field_4).rowcols)->score_row + lVar38);
                  *puVar3 = 0x8000800080008;
                  puVar3[1] = 0x8000800080008;
                  lVar38 = lVar38 + 0x10;
                } while (lVar44 != lVar38);
                uVar53 = (int)uVar51 - 1;
                lVar46 = 0;
                local_98 = auVar62._0_2_;
                uStack_96 = auVar62._2_2_;
                lVar38 = lVar44;
                uVar40 = 0;
                uVar67 = local_88;
                uVar72 = uStack_86;
                uVar73 = local_88;
                uVar74 = uStack_86;
                uVar75 = local_88;
                uVar76 = uStack_86;
                uVar77 = local_88;
                uVar78 = uStack_86;
                uVar79 = local_98;
                uVar82 = uStack_96;
                uVar83 = local_98;
                uVar85 = uStack_96;
                uVar86 = local_98;
                uVar88 = uStack_96;
                uVar89 = local_98;
                uVar91 = uStack_96;
                do {
                  local_f0 = ptr_01;
                  ptr_04 = ptr;
                  ptr_01 = palVar36;
                  ptr = palVar35;
                  uVar1 = ptr[uVar53][0];
                  auVar137._8_8_ = ptr[uVar53][1] << 0x10 | uVar1 >> 0x30;
                  auVar137._0_8_ = uVar1 << 0x10 | (ulong)(ushort)ptr_03[uVar40];
                  lVar50 = (long)ppVar8->mapper[(byte)s2[uVar40]] * uVar51;
                  uVar1 = uVar40 + 1;
                  uVar45 = 1;
                  lVar47 = 0;
                  auVar60._4_2_ = local_88;
                  auVar60._0_4_ = auVar57._0_4_;
                  auVar60._6_2_ = uStack_86;
                  auVar60._8_2_ = local_88;
                  auVar60._10_2_ = uStack_86;
                  auVar60._12_2_ = local_88;
                  auVar60._14_2_ = uStack_86;
                  do {
                    auVar62 = *(undefined1 (*) [16])((long)*ptr_00 + lVar47);
                    auVar137 = paddsw(auVar137,*(undefined1 (*) [16])
                                                ((long)pvVar7 + lVar47 + lVar50 * 0x10));
                    sVar33 = auVar62._0_2_;
                    uVar95 = auVar137._0_2_;
                    uVar94 = (ushort)((short)uVar95 < sVar33) * sVar33 |
                             ((short)uVar95 >= sVar33) * uVar95;
                    sVar12 = auVar62._2_2_;
                    uVar99 = auVar137._2_2_;
                    uVar98 = (ushort)((short)uVar99 < sVar12) * sVar12 |
                             ((short)uVar99 >= sVar12) * uVar99;
                    sVar134 = auVar62._4_2_;
                    uVar102 = auVar137._4_2_;
                    uVar101 = (ushort)((short)uVar102 < sVar134) * sVar134 |
                              ((short)uVar102 >= sVar134) * uVar102;
                    sVar144 = auVar62._6_2_;
                    uVar105 = auVar137._6_2_;
                    uVar104 = (ushort)((short)uVar105 < sVar144) * sVar144 |
                              ((short)uVar105 >= sVar144) * uVar105;
                    sVar15 = auVar62._8_2_;
                    uVar108 = auVar137._8_2_;
                    uVar107 = (ushort)((short)uVar108 < sVar15) * sVar15 |
                              ((short)uVar108 >= sVar15) * uVar108;
                    sVar18 = auVar62._10_2_;
                    uVar111 = auVar137._10_2_;
                    uVar110 = (ushort)((short)uVar111 < sVar18) * sVar18 |
                              ((short)uVar111 >= sVar18) * uVar111;
                    sVar21 = auVar62._12_2_;
                    uVar114 = auVar137._12_2_;
                    uVar117 = auVar137._14_2_;
                    uVar113 = (ushort)((short)uVar114 < sVar21) * sVar21 |
                              ((short)uVar114 >= sVar21) * uVar114;
                    sVar24 = auVar62._14_2_;
                    uVar116 = (ushort)((short)uVar117 < sVar24) * sVar24 |
                              ((short)uVar117 >= sVar24) * uVar117;
                    sVar10 = auVar60._0_2_;
                    auVar63._0_2_ =
                         (ushort)((short)uVar94 < sVar10) * sVar10 |
                         ((short)uVar94 >= sVar10) * uVar94;
                    sVar13 = auVar60._2_2_;
                    auVar63._2_2_ =
                         (ushort)((short)uVar98 < sVar13) * sVar13 |
                         ((short)uVar98 >= sVar13) * uVar98;
                    sVar140 = auVar60._4_2_;
                    auVar63._4_2_ =
                         (ushort)((short)uVar101 < sVar140) * sVar140 |
                         ((short)uVar101 >= sVar140) * uVar101;
                    sVar146 = auVar60._6_2_;
                    auVar63._6_2_ =
                         (ushort)((short)uVar104 < sVar146) * sVar146 |
                         ((short)uVar104 >= sVar146) * uVar104;
                    sVar16 = auVar60._8_2_;
                    auVar63._8_2_ =
                         (ushort)((short)uVar107 < sVar16) * sVar16 |
                         ((short)uVar107 >= sVar16) * uVar107;
                    sVar19 = auVar60._10_2_;
                    auVar63._10_2_ =
                         (ushort)((short)uVar110 < sVar19) * sVar19 |
                         ((short)uVar110 >= sVar19) * uVar110;
                    sVar22 = auVar60._12_2_;
                    auVar63._12_2_ =
                         (ushort)((short)uVar113 < sVar22) * sVar22 |
                         ((short)uVar113 >= sVar22) * uVar113;
                    sVar25 = auVar60._14_2_;
                    auVar63._14_2_ =
                         (ushort)((short)uVar116 < sVar25) * sVar25 |
                         ((short)uVar116 >= sVar25) * uVar116;
                    *(undefined1 (*) [16])((long)*ptr_04 + lVar47) = auVar63;
                    uVar133 = -(ushort)(uVar95 == auVar63._0_2_) & 4 |
                              ~-(ushort)(uVar95 == auVar63._0_2_) & 2 - (sVar10 < (short)uVar94);
                    uVar139 = -(ushort)(uVar99 == auVar63._2_2_) & 4 |
                              ~-(ushort)(uVar99 == auVar63._2_2_) & 2 - (sVar13 < (short)uVar98);
                    uVar141 = -(ushort)(uVar102 == auVar63._4_2_) & 4 |
                              ~-(ushort)(uVar102 == auVar63._4_2_) & 2 - (sVar140 < (short)uVar101);
                    uVar143 = -(ushort)(uVar105 == auVar63._6_2_) & 4 |
                              ~-(ushort)(uVar105 == auVar63._6_2_) & 2 - (sVar146 < (short)uVar104);
                    uVar107 = -(ushort)(uVar108 == auVar63._8_2_) & 4 |
                              ~-(ushort)(uVar108 == auVar63._8_2_) & 2 - (sVar16 < (short)uVar107);
                    uVar108 = -(ushort)(uVar111 == auVar63._10_2_) & 4 |
                              ~-(ushort)(uVar111 == auVar63._10_2_) & 2 - (sVar19 < (short)uVar110);
                    uVar110 = -(ushort)(uVar114 == auVar63._12_2_) & 4 |
                              ~-(ushort)(uVar114 == auVar63._12_2_) & 2 - (sVar22 < (short)uVar113);
                    uVar111 = -(ushort)(uVar117 == auVar63._14_2_) & 4 |
                              ~-(ushort)(uVar117 == auVar63._14_2_) & 2 - (sVar25 < (short)uVar116);
                    puVar4 = (ushort *)
                             ((long)((ppVar34->field_4).rowcols)->score_row + lVar47 + lVar46);
                    uVar94 = *puVar4;
                    uVar95 = puVar4[1];
                    uVar98 = puVar4[2];
                    uVar99 = puVar4[3];
                    uVar101 = puVar4[4];
                    uVar102 = puVar4[5];
                    uVar104 = puVar4[6];
                    uVar105 = puVar4[7];
                    puVar4 = (ushort *)((long)*ptr_02 + lVar47);
                    *puVar4 = uVar133;
                    puVar4[1] = uVar139;
                    puVar4[2] = uVar141;
                    puVar4[3] = uVar143;
                    puVar4[4] = uVar107;
                    puVar4[5] = uVar108;
                    puVar4[6] = uVar110;
                    puVar4[7] = uVar111;
                    puVar4 = (ushort *)
                             ((long)((ppVar34->field_4).rowcols)->score_row + lVar47 + lVar46);
                    *puVar4 = uVar94 | uVar133;
                    puVar4[1] = uVar95 | uVar139;
                    puVar4[2] = uVar98 | uVar141;
                    puVar4[3] = uVar99 | uVar143;
                    puVar4[4] = uVar101 | uVar107;
                    puVar4[5] = uVar102 | uVar108;
                    puVar4[6] = uVar104 | uVar110;
                    puVar4[7] = uVar105 | uVar111;
                    auVar123 = psubsw(auVar63,auVar66);
                    auVar27._4_4_ = uVar54;
                    auVar27._0_4_ = uVar54;
                    auVar27._8_4_ = uVar54;
                    auVar27._12_4_ = uVar54;
                    auVar62 = psubsw(auVar62,auVar27);
                    sVar11 = auVar123._0_2_;
                    sVar96 = auVar62._0_2_;
                    sVar14 = auVar123._2_2_;
                    sVar100 = auVar62._2_2_;
                    sVar142 = auVar123._4_2_;
                    sVar103 = auVar62._4_2_;
                    sVar147 = auVar123._6_2_;
                    sVar106 = auVar62._6_2_;
                    sVar17 = auVar123._8_2_;
                    sVar109 = auVar62._8_2_;
                    sVar20 = auVar123._10_2_;
                    sVar112 = auVar62._10_2_;
                    sVar23 = auVar123._12_2_;
                    sVar115 = auVar62._12_2_;
                    sVar118 = auVar62._14_2_;
                    sVar26 = auVar123._14_2_;
                    puVar4 = (ushort *)((long)*ptr_00 + lVar47);
                    *puVar4 = (ushort)(sVar96 < sVar11) * sVar11 |
                              (ushort)(sVar96 >= sVar11) * sVar96;
                    puVar4[1] = (ushort)(sVar100 < sVar14) * sVar14 |
                                (ushort)(sVar100 >= sVar14) * sVar100;
                    puVar4[2] = (ushort)(sVar103 < sVar142) * sVar142 |
                                (ushort)(sVar103 >= sVar142) * sVar103;
                    puVar4[3] = (ushort)(sVar106 < sVar147) * sVar147 |
                                (ushort)(sVar106 >= sVar147) * sVar106;
                    puVar4[4] = (ushort)(sVar109 < sVar17) * sVar17 |
                                (ushort)(sVar109 >= sVar17) * sVar109;
                    puVar4[5] = (ushort)(sVar112 < sVar20) * sVar20 |
                                (ushort)(sVar112 >= sVar20) * sVar112;
                    puVar4[6] = (ushort)(sVar115 < sVar23) * sVar23 |
                                (ushort)(sVar115 >= sVar23) * sVar115;
                    puVar4[7] = (ushort)(sVar118 < sVar26) * sVar26 |
                                (ushort)(sVar118 >= sVar26) * sVar118;
                    auVar28._4_4_ = uVar54;
                    auVar28._0_4_ = uVar54;
                    auVar28._8_4_ = uVar54;
                    auVar28._12_4_ = uVar54;
                    auVar62 = psubsw(*(undefined1 (*) [16])((long)*ptr_01 + lVar47),auVar28);
                    sVar96 = auVar62._0_2_;
                    sVar100 = auVar62._2_2_;
                    sVar103 = auVar62._4_2_;
                    sVar106 = auVar62._6_2_;
                    sVar109 = auVar62._8_2_;
                    sVar112 = auVar62._10_2_;
                    sVar115 = auVar62._12_2_;
                    sVar118 = auVar62._14_2_;
                    puVar4 = (ushort *)((long)*local_f0 + lVar47);
                    *puVar4 = (ushort)(sVar11 < sVar96) * sVar96 |
                              (ushort)(sVar11 >= sVar96) * sVar11;
                    puVar4[1] = (ushort)(sVar14 < sVar100) * sVar100 |
                                (ushort)(sVar14 >= sVar100) * sVar14;
                    puVar4[2] = (ushort)(sVar142 < sVar103) * sVar103 |
                                (ushort)(sVar142 >= sVar103) * sVar142;
                    puVar4[3] = (ushort)(sVar147 < sVar106) * sVar106 |
                                (ushort)(sVar147 >= sVar106) * sVar147;
                    puVar4[4] = (ushort)(sVar17 < sVar109) * sVar109 |
                                (ushort)(sVar17 >= sVar109) * sVar17;
                    puVar4[5] = (ushort)(sVar20 < sVar112) * sVar112 |
                                (ushort)(sVar20 >= sVar112) * sVar20;
                    puVar4[6] = (ushort)(sVar23 < sVar115) * sVar115 |
                                (ushort)(sVar23 >= sVar115) * sVar23;
                    puVar4[7] = (ushort)(sVar26 < sVar118) * sVar118 |
                                (ushort)(sVar26 >= sVar118) * sVar26;
                    if (uVar1 < uVar61) {
                      puVar4 = (ushort *)
                               ((long)((ppVar34->field_4).rowcols)->score_row + lVar47 + lVar38);
                      *puVar4 = -(ushort)(sVar96 < sVar11) & 0x18 ^ 0x10;
                      puVar4[1] = -(ushort)(sVar100 < sVar14) & 0x18 ^ 0x10;
                      puVar4[2] = -(ushort)(sVar103 < sVar142) & 0x18 ^ 0x10;
                      puVar4[3] = -(ushort)(sVar106 < sVar147) & 0x18 ^ 0x10;
                      puVar4[4] = -(ushort)(sVar109 < sVar17) & 0x18 ^ 0x10;
                      puVar4[5] = -(ushort)(sVar112 < sVar20) & 0x18 ^ 0x10;
                      puVar4[6] = -(ushort)(sVar115 < sVar23) & 0x18 ^ 0x10;
                      puVar4[7] = -(ushort)(sVar118 < sVar26) & 0x18 ^ 0x10;
                    }
                    auVar29._4_4_ = uVar54;
                    auVar29._0_4_ = uVar54;
                    auVar29._8_4_ = uVar54;
                    auVar29._12_4_ = uVar54;
                    auVar152 = psubsw(auVar60,auVar29);
                    sVar96 = auVar152._0_2_;
                    sVar100 = auVar152._2_2_;
                    sVar103 = auVar152._4_2_;
                    sVar106 = auVar152._6_2_;
                    sVar109 = auVar152._8_2_;
                    sVar112 = auVar152._10_2_;
                    sVar115 = auVar152._12_2_;
                    sVar118 = auVar152._14_2_;
                    if (uVar45 < uVar51) {
                      piVar9 = ((ppVar34->field_4).rowcols)->score_row;
                      puVar4 = (ushort *)((long)piVar9 + lVar47 + 0x10 + lVar46);
                      uVar94 = puVar4[1];
                      uVar95 = puVar4[2];
                      uVar98 = puVar4[3];
                      uVar99 = puVar4[4];
                      uVar101 = puVar4[5];
                      uVar102 = puVar4[6];
                      uVar104 = puVar4[7];
                      puVar6 = (ushort *)((long)piVar9 + lVar47 + 0x10 + lVar46);
                      *puVar6 = -(ushort)(sVar96 < sVar11) & 0x60 ^ 0x40 | *puVar4;
                      puVar6[1] = -(ushort)(sVar100 < sVar14) & 0x60 ^ 0x40 | uVar94;
                      puVar6[2] = -(ushort)(sVar103 < sVar142) & 0x60 ^ 0x40 | uVar95;
                      puVar6[3] = -(ushort)(sVar106 < sVar147) & 0x60 ^ 0x40 | uVar98;
                      puVar6[4] = -(ushort)(sVar109 < sVar17) & 0x60 ^ 0x40 | uVar99;
                      puVar6[5] = -(ushort)(sVar112 < sVar20) & 0x60 ^ 0x40 | uVar101;
                      puVar6[6] = -(ushort)(sVar115 < sVar23) & 0x60 ^ 0x40 | uVar102;
                      puVar6[7] = -(ushort)(sVar118 < sVar26) & 0x60 ^ 0x40 | uVar104;
                    }
                    uVar67 = ((short)uVar67 < (short)auVar63._0_2_) * auVar63._0_2_ |
                             ((short)uVar67 >= (short)auVar63._0_2_) * uVar67;
                    uVar72 = ((short)uVar72 < (short)auVar63._2_2_) * auVar63._2_2_ |
                             ((short)uVar72 >= (short)auVar63._2_2_) * uVar72;
                    uVar73 = ((short)uVar73 < (short)auVar63._4_2_) * auVar63._4_2_ |
                             ((short)uVar73 >= (short)auVar63._4_2_) * uVar73;
                    uVar74 = ((short)uVar74 < (short)auVar63._6_2_) * auVar63._6_2_ |
                             ((short)uVar74 >= (short)auVar63._6_2_) * uVar74;
                    uVar75 = ((short)uVar75 < (short)auVar63._8_2_) * auVar63._8_2_ |
                             ((short)uVar75 >= (short)auVar63._8_2_) * uVar75;
                    uVar76 = ((short)uVar76 < (short)auVar63._10_2_) * auVar63._10_2_ |
                             ((short)uVar76 >= (short)auVar63._10_2_) * uVar76;
                    uVar77 = ((short)uVar77 < (short)auVar63._12_2_) * auVar63._12_2_ |
                             ((short)uVar77 >= (short)auVar63._12_2_) * uVar77;
                    uVar78 = ((short)uVar78 < (short)auVar63._14_2_) * auVar63._14_2_ |
                             ((short)uVar78 >= (short)auVar63._14_2_) * uVar78;
                    uVar79 = (ushort)(sVar33 < (short)uVar79) * sVar33 |
                             (sVar33 >= (short)uVar79) * uVar79;
                    uVar82 = (ushort)(sVar12 < (short)uVar82) * sVar12 |
                             (sVar12 >= (short)uVar82) * uVar82;
                    uVar83 = (ushort)(sVar134 < (short)uVar83) * sVar134 |
                             (sVar134 >= (short)uVar83) * uVar83;
                    uVar85 = (ushort)(sVar144 < (short)uVar85) * sVar144 |
                             (sVar144 >= (short)uVar85) * uVar85;
                    uVar86 = (ushort)(sVar15 < (short)uVar86) * sVar15 |
                             (sVar15 >= (short)uVar86) * uVar86;
                    uVar88 = (ushort)(sVar18 < (short)uVar88) * sVar18 |
                             (sVar18 >= (short)uVar88) * uVar88;
                    uVar89 = (ushort)(sVar21 < (short)uVar89) * sVar21 |
                             (sVar21 >= (short)uVar89) * uVar89;
                    uVar91 = (ushort)(sVar24 < (short)uVar91) * sVar24 |
                             (sVar24 >= (short)uVar91) * uVar91;
                    uVar79 = (ushort)(sVar10 < (short)uVar79) * sVar10 |
                             (sVar10 >= (short)uVar79) * uVar79;
                    uVar82 = (ushort)(sVar13 < (short)uVar82) * sVar13 |
                             (sVar13 >= (short)uVar82) * uVar82;
                    uVar83 = (ushort)(sVar140 < (short)uVar83) * sVar140 |
                             (sVar140 >= (short)uVar83) * uVar83;
                    uVar85 = (ushort)(sVar146 < (short)uVar85) * sVar146 |
                             (sVar146 >= (short)uVar85) * uVar85;
                    uVar86 = (ushort)(sVar16 < (short)uVar86) * sVar16 |
                             (sVar16 >= (short)uVar86) * uVar86;
                    uVar88 = (ushort)(sVar19 < (short)uVar88) * sVar19 |
                             (sVar19 >= (short)uVar88) * uVar88;
                    uVar89 = (ushort)(sVar22 < (short)uVar89) * sVar22 |
                             (sVar22 >= (short)uVar89) * uVar89;
                    uVar91 = (ushort)(sVar25 < (short)uVar91) * sVar25 |
                             (sVar25 >= (short)uVar91) * uVar91;
                    uVar79 = ((short)auVar63._0_2_ < (short)uVar79) * auVar63._0_2_ |
                             ((short)auVar63._0_2_ >= (short)uVar79) * uVar79;
                    uVar82 = ((short)auVar63._2_2_ < (short)uVar82) * auVar63._2_2_ |
                             ((short)auVar63._2_2_ >= (short)uVar82) * uVar82;
                    uVar83 = ((short)auVar63._4_2_ < (short)uVar83) * auVar63._4_2_ |
                             ((short)auVar63._4_2_ >= (short)uVar83) * uVar83;
                    uVar85 = ((short)auVar63._6_2_ < (short)uVar85) * auVar63._6_2_ |
                             ((short)auVar63._6_2_ >= (short)uVar85) * uVar85;
                    uVar86 = ((short)auVar63._8_2_ < (short)uVar86) * auVar63._8_2_ |
                             ((short)auVar63._8_2_ >= (short)uVar86) * uVar86;
                    uVar88 = ((short)auVar63._10_2_ < (short)uVar88) * auVar63._10_2_ |
                             ((short)auVar63._10_2_ >= (short)uVar88) * uVar88;
                    uVar89 = ((short)auVar63._12_2_ < (short)uVar89) * auVar63._12_2_ |
                             ((short)auVar63._12_2_ >= (short)uVar89) * uVar89;
                    uVar91 = ((short)auVar63._14_2_ < (short)uVar91) * auVar63._14_2_ |
                             ((short)auVar63._14_2_ >= (short)uVar91) * uVar91;
                    auVar60._0_2_ =
                         (ushort)(sVar11 < sVar96) * sVar96 | (ushort)(sVar11 >= sVar96) * sVar11;
                    auVar60._2_2_ =
                         (ushort)(sVar14 < sVar100) * sVar100 | (ushort)(sVar14 >= sVar100) * sVar14
                    ;
                    auVar60._4_2_ =
                         (ushort)(sVar142 < sVar103) * sVar103 |
                         (ushort)(sVar142 >= sVar103) * sVar142;
                    auVar60._6_2_ =
                         (ushort)(sVar147 < sVar106) * sVar106 |
                         (ushort)(sVar147 >= sVar106) * sVar147;
                    auVar60._8_2_ =
                         (ushort)(sVar17 < sVar109) * sVar109 | (ushort)(sVar17 >= sVar109) * sVar17
                    ;
                    auVar60._10_2_ =
                         (ushort)(sVar20 < sVar112) * sVar112 | (ushort)(sVar20 >= sVar112) * sVar20
                    ;
                    auVar60._12_2_ =
                         (ushort)(sVar23 < sVar115) * sVar115 | (ushort)(sVar23 >= sVar115) * sVar23
                    ;
                    auVar60._14_2_ =
                         (ushort)(sVar26 < sVar118) * sVar118 | (ushort)(sVar26 >= sVar118) * sVar26
                    ;
                    auVar137 = *(undefined1 (*) [16])((long)*ptr + lVar47);
                    lVar47 = lVar47 + 0x10;
                    uVar45 = uVar45 + 1;
                  } while (lVar44 != lVar47);
                  iVar43 = 0;
                  auVar149 = auVar60;
                  do {
                    uVar45 = (ulong)(uint)(ptr_03[uVar1] - open);
                    if (ptr_03[uVar1] - open < -0x7fff) {
                      uVar45 = 0xffff8000;
                    }
                    uVar56 = ptr[uVar53][0];
                    auVar138._8_8_ = ptr[uVar53][1] << 0x10 | uVar56 >> 0x30;
                    auVar138._0_8_ = uVar56 << 0x10 | (ulong)(ushort)ptr_03[uVar40];
                    uVar56 = auVar123._0_8_;
                    auVar123._8_8_ = auVar123._8_8_ << 0x10 | uVar56 >> 0x30;
                    auVar123._0_8_ = uVar56 << 0x10 | uVar45 & 0xffff;
                    uVar56 = auVar60._0_8_;
                    auVar60._8_8_ = auVar60._8_8_ << 0x10 | uVar56 >> 0x30;
                    auVar60._0_8_ = uVar56 << 0x10 | uVar45 & 0xffff;
                    uVar56 = auVar152._0_8_;
                    auVar152._8_8_ = auVar152._8_8_ << 0x10 | uVar56 >> 0x30;
                    local_104 = (ushort)uVar41;
                    auVar152._0_8_ = uVar56 << 0x10 | (ulong)local_104;
                    uVar56 = auVar149._0_8_;
                    auVar149._8_8_ = auVar149._8_8_ << 0x10 | uVar56 >> 0x30;
                    auVar149._0_8_ = uVar56 << 0x10 | uVar45 & 0xffff;
                    lVar47 = 0;
                    do {
                      psVar5 = (short *)((long)*ptr_04 + lVar47);
                      sVar134 = *psVar5;
                      sVar140 = psVar5[1];
                      sVar142 = psVar5[2];
                      sVar103 = psVar5[3];
                      sVar144 = psVar5[4];
                      sVar146 = psVar5[5];
                      sVar147 = psVar5[6];
                      sVar106 = psVar5[7];
                      sVar33 = auVar60._0_2_;
                      auVar97._0_2_ =
                           (ushort)(sVar134 < sVar33) * sVar33 |
                           (ushort)(sVar134 >= sVar33) * sVar134;
                      sVar10 = auVar60._2_2_;
                      auVar97._2_2_ =
                           (ushort)(sVar140 < sVar10) * sVar10 |
                           (ushort)(sVar140 >= sVar10) * sVar140;
                      sVar11 = auVar60._4_2_;
                      auVar97._4_2_ =
                           (ushort)(sVar142 < sVar11) * sVar11 |
                           (ushort)(sVar142 >= sVar11) * sVar142;
                      sVar96 = auVar60._6_2_;
                      auVar97._6_2_ =
                           (ushort)(sVar103 < sVar96) * sVar96 |
                           (ushort)(sVar103 >= sVar96) * sVar103;
                      sVar12 = auVar60._8_2_;
                      auVar97._8_2_ =
                           (ushort)(sVar144 < sVar12) * sVar12 |
                           (ushort)(sVar144 >= sVar12) * sVar144;
                      sVar13 = auVar60._10_2_;
                      auVar97._10_2_ =
                           (ushort)(sVar146 < sVar13) * sVar13 |
                           (ushort)(sVar146 >= sVar13) * sVar146;
                      sVar14 = auVar60._12_2_;
                      auVar97._12_2_ =
                           (ushort)(sVar147 < sVar14) * sVar14 |
                           (ushort)(sVar147 >= sVar14) * sVar147;
                      sVar100 = auVar60._14_2_;
                      auVar97._14_2_ =
                           (ushort)(sVar106 < sVar100) * sVar100 |
                           (ushort)(sVar106 >= sVar100) * sVar106;
                      *(undefined1 (*) [16])((long)*ptr_04 + lVar47) = auVar97;
                      auVar62 = paddsw(auVar138,*(undefined1 (*) [16])
                                                 ((long)pvVar7 + lVar47 + lVar50 * 0x10));
                      uVar107 = -(ushort)(sVar33 < sVar134 || auVar62._0_2_ == auVar97._0_2_);
                      uVar108 = -(ushort)(sVar10 < sVar140 || auVar62._2_2_ == auVar97._2_2_);
                      uVar110 = -(ushort)(sVar11 < sVar142 || auVar62._4_2_ == auVar97._4_2_);
                      uVar111 = -(ushort)(sVar96 < sVar103 || auVar62._6_2_ == auVar97._6_2_);
                      uVar113 = -(ushort)(sVar12 < sVar144 || auVar62._8_2_ == auVar97._8_2_);
                      uVar114 = -(ushort)(sVar13 < sVar146 || auVar62._10_2_ == auVar97._10_2_);
                      uVar116 = -(ushort)(sVar14 < sVar147 || auVar62._12_2_ == auVar97._12_2_);
                      uVar117 = -(ushort)(sVar100 < sVar106 || auVar62._14_2_ == auVar97._14_2_);
                      puVar4 = (ushort *)
                               ((long)((ppVar34->field_4).rowcols)->score_row + lVar47 + lVar46);
                      uVar94 = *puVar4;
                      uVar95 = puVar4[1];
                      uVar98 = puVar4[2];
                      uVar99 = puVar4[3];
                      uVar101 = puVar4[4];
                      uVar102 = puVar4[5];
                      uVar104 = puVar4[6];
                      uVar105 = puVar4[7];
                      puVar4 = (ushort *)((long)*ptr_02 + lVar47);
                      uVar107 = ~uVar107 & 2 | *puVar4 & uVar107;
                      uVar108 = ~uVar108 & 2 | puVar4[1] & uVar108;
                      uVar110 = ~uVar110 & 2 | puVar4[2] & uVar110;
                      uVar111 = ~uVar111 & 2 | puVar4[3] & uVar111;
                      uVar113 = ~uVar113 & 2 | puVar4[4] & uVar113;
                      uVar114 = ~uVar114 & 2 | puVar4[5] & uVar114;
                      uVar116 = ~uVar116 & 2 | puVar4[6] & uVar116;
                      uVar117 = ~uVar117 & 2 | puVar4[7] & uVar117;
                      puVar4 = (ushort *)((long)*ptr_02 + lVar47);
                      *puVar4 = uVar107;
                      puVar4[1] = uVar108;
                      puVar4[2] = uVar110;
                      puVar4[3] = uVar111;
                      puVar4[4] = uVar113;
                      puVar4[5] = uVar114;
                      puVar4[6] = uVar116;
                      puVar4[7] = uVar117;
                      puVar4 = (ushort *)
                               ((long)((ppVar34->field_4).rowcols)->score_row + lVar47 + lVar46);
                      *puVar4 = uVar107 | uVar94 & 0x78;
                      puVar4[1] = uVar108 | uVar95 & 0x78;
                      puVar4[2] = uVar110 | uVar98 & 0x78;
                      puVar4[3] = uVar111 | uVar99 & 0x78;
                      puVar4[4] = uVar113 | uVar101 & 0x78;
                      puVar4[5] = uVar114 | uVar102 & 0x78;
                      puVar4[6] = uVar116 | uVar104 & 0x78;
                      puVar4[7] = uVar117 | uVar105 & 0x78;
                      piVar9 = ((ppVar34->field_4).rowcols)->score_row;
                      puVar4 = (ushort *)((long)piVar9 + lVar47 + lVar46);
                      uVar94 = puVar4[1];
                      uVar95 = puVar4[2];
                      uVar98 = puVar4[3];
                      uVar99 = puVar4[4];
                      uVar101 = puVar4[5];
                      uVar102 = puVar4[6];
                      uVar104 = puVar4[7];
                      puVar6 = (ushort *)((long)piVar9 + lVar47 + lVar46);
                      *puVar6 = (*puVar4 & 0x1f | -(ushort)(auVar152._0_2_ < auVar123._0_2_) & 0x60)
                                ^ 0x40;
                      puVar6[1] = (uVar94 & 0x1f | -(ushort)(auVar152._2_2_ < auVar123._2_2_) & 0x60
                                  ) ^ 0x40;
                      puVar6[2] = (uVar95 & 0x1f | -(ushort)(auVar152._4_2_ < auVar123._4_2_) & 0x60
                                  ) ^ 0x40;
                      puVar6[3] = (uVar98 & 0x1f | -(ushort)(auVar152._6_2_ < auVar123._6_2_) & 0x60
                                  ) ^ 0x40;
                      puVar6[4] = (uVar99 & 0x1f | -(ushort)(auVar152._8_2_ < auVar123._8_2_) & 0x60
                                  ) ^ 0x40;
                      puVar6[5] = (uVar101 & 0x1f |
                                  -(ushort)(auVar152._10_2_ < auVar123._10_2_) & 0x60) ^ 0x40;
                      puVar6[6] = (uVar102 & 0x1f |
                                  -(ushort)(auVar152._12_2_ < auVar123._12_2_) & 0x60) ^ 0x40;
                      puVar6[7] = (uVar104 & 0x1f |
                                  -(ushort)(auVar152._14_2_ < auVar123._14_2_) & 0x60) ^ 0x40;
                      auVar123 = psubsw(auVar97,auVar66);
                      auVar30._4_4_ = uVar54;
                      auVar30._0_4_ = uVar54;
                      auVar30._8_4_ = uVar54;
                      auVar30._12_4_ = uVar54;
                      auVar62 = psubsw(*(undefined1 (*) [16])((long)*ptr_01 + lVar47),auVar30);
                      sVar33 = auVar62._0_2_;
                      sVar134 = auVar123._0_2_;
                      sVar10 = auVar62._2_2_;
                      sVar140 = auVar123._2_2_;
                      sVar11 = auVar62._4_2_;
                      sVar142 = auVar123._4_2_;
                      sVar96 = auVar62._6_2_;
                      sVar103 = auVar123._6_2_;
                      sVar12 = auVar62._8_2_;
                      sVar144 = auVar123._8_2_;
                      sVar13 = auVar62._10_2_;
                      sVar146 = auVar123._10_2_;
                      sVar14 = auVar62._12_2_;
                      sVar147 = auVar123._12_2_;
                      sVar106 = auVar123._14_2_;
                      sVar100 = auVar62._14_2_;
                      puVar4 = (ushort *)((long)*local_f0 + lVar47);
                      *puVar4 = (ushort)(sVar134 < sVar33) * sVar33 |
                                (ushort)(sVar134 >= sVar33) * sVar134;
                      puVar4[1] = (ushort)(sVar140 < sVar10) * sVar10 |
                                  (ushort)(sVar140 >= sVar10) * sVar140;
                      puVar4[2] = (ushort)(sVar142 < sVar11) * sVar11 |
                                  (ushort)(sVar142 >= sVar11) * sVar142;
                      puVar4[3] = (ushort)(sVar103 < sVar96) * sVar96 |
                                  (ushort)(sVar103 >= sVar96) * sVar103;
                      puVar4[4] = (ushort)(sVar144 < sVar12) * sVar12 |
                                  (ushort)(sVar144 >= sVar12) * sVar144;
                      puVar4[5] = (ushort)(sVar146 < sVar13) * sVar13 |
                                  (ushort)(sVar146 >= sVar13) * sVar146;
                      puVar4[6] = (ushort)(sVar147 < sVar14) * sVar14 |
                                  (ushort)(sVar147 >= sVar14) * sVar147;
                      puVar4[7] = (ushort)(sVar106 < sVar100) * sVar100 |
                                  (ushort)(sVar106 >= sVar100) * sVar106;
                      if (uVar1 < uVar61) {
                        puVar4 = (ushort *)
                                 ((long)((ppVar34->field_4).rowcols)->score_row + lVar47 + lVar38);
                        *puVar4 = -(ushort)(sVar33 < sVar134) & 0x18 ^ 0x10;
                        puVar4[1] = -(ushort)(sVar10 < sVar140) & 0x18 ^ 0x10;
                        puVar4[2] = -(ushort)(sVar11 < sVar142) & 0x18 ^ 0x10;
                        puVar4[3] = -(ushort)(sVar96 < sVar103) & 0x18 ^ 0x10;
                        puVar4[4] = -(ushort)(sVar12 < sVar144) & 0x18 ^ 0x10;
                        puVar4[5] = -(ushort)(sVar13 < sVar146) & 0x18 ^ 0x10;
                        puVar4[6] = -(ushort)(sVar14 < sVar147) & 0x18 ^ 0x10;
                        puVar4[7] = -(ushort)(sVar100 < sVar106) & 0x18 ^ 0x10;
                      }
                      uVar79 = ((short)auVar97._0_2_ < (short)uVar79) * auVar97._0_2_ |
                               ((short)auVar97._0_2_ >= (short)uVar79) * uVar79;
                      uVar82 = ((short)auVar97._2_2_ < (short)uVar82) * auVar97._2_2_ |
                               ((short)auVar97._2_2_ >= (short)uVar82) * uVar82;
                      uVar83 = ((short)auVar97._4_2_ < (short)uVar83) * auVar97._4_2_ |
                               ((short)auVar97._4_2_ >= (short)uVar83) * uVar83;
                      uVar85 = ((short)auVar97._6_2_ < (short)uVar85) * auVar97._6_2_ |
                               ((short)auVar97._6_2_ >= (short)uVar85) * uVar85;
                      uVar86 = ((short)auVar97._8_2_ < (short)uVar86) * auVar97._8_2_ |
                               ((short)auVar97._8_2_ >= (short)uVar86) * uVar86;
                      uVar88 = ((short)auVar97._10_2_ < (short)uVar88) * auVar97._10_2_ |
                               ((short)auVar97._10_2_ >= (short)uVar88) * uVar88;
                      uVar89 = ((short)auVar97._12_2_ < (short)uVar89) * auVar97._12_2_ |
                               ((short)auVar97._12_2_ >= (short)uVar89) * uVar89;
                      uVar91 = ((short)auVar97._14_2_ < (short)uVar91) * auVar97._14_2_ |
                               ((short)auVar97._14_2_ >= (short)uVar91) * uVar91;
                      uVar67 = ((short)uVar67 < (short)auVar97._0_2_) * auVar97._0_2_ |
                               ((short)uVar67 >= (short)auVar97._0_2_) * uVar67;
                      uVar72 = ((short)uVar72 < (short)auVar97._2_2_) * auVar97._2_2_ |
                               ((short)uVar72 >= (short)auVar97._2_2_) * uVar72;
                      uVar73 = ((short)uVar73 < (short)auVar97._4_2_) * auVar97._4_2_ |
                               ((short)uVar73 >= (short)auVar97._4_2_) * uVar73;
                      uVar74 = ((short)uVar74 < (short)auVar97._6_2_) * auVar97._6_2_ |
                               ((short)uVar74 >= (short)auVar97._6_2_) * uVar74;
                      uVar75 = ((short)uVar75 < (short)auVar97._8_2_) * auVar97._8_2_ |
                               ((short)uVar75 >= (short)auVar97._8_2_) * uVar75;
                      uVar76 = ((short)uVar76 < (short)auVar97._10_2_) * auVar97._10_2_ |
                               ((short)uVar76 >= (short)auVar97._10_2_) * uVar76;
                      uVar77 = ((short)uVar77 < (short)auVar97._12_2_) * auVar97._12_2_ |
                               ((short)uVar77 >= (short)auVar97._12_2_) * uVar77;
                      uVar78 = ((short)uVar78 < (short)auVar97._14_2_) * auVar97._14_2_ |
                               ((short)uVar78 >= (short)auVar97._14_2_) * uVar78;
                      auVar31._4_4_ = uVar54;
                      auVar31._0_4_ = uVar54;
                      auVar31._8_4_ = uVar54;
                      auVar31._12_4_ = uVar54;
                      auVar60 = psubsw(auVar60,auVar31);
                      auVar64._0_2_ = -(ushort)(auVar60._0_2_ < sVar134);
                      auVar64._2_2_ = -(ushort)(auVar60._2_2_ < sVar140);
                      auVar64._4_2_ = -(ushort)(auVar60._4_2_ < sVar142);
                      auVar64._6_2_ = -(ushort)(auVar60._6_2_ < sVar103);
                      auVar64._8_2_ = -(ushort)(auVar60._8_2_ < sVar144);
                      auVar64._10_2_ = -(ushort)(auVar60._10_2_ < sVar146);
                      auVar64._12_2_ = -(ushort)(auVar60._12_2_ < sVar147);
                      auVar64._14_2_ = -(ushort)(auVar60._14_2_ < sVar106);
                      if ((ushort)((ushort)(SUB161(auVar64 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar64 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar64 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar64 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar64 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar64 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar64 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar64 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar64 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar64 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar64 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar64 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar64 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar64 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)((byte)(auVar64._14_2_ >> 7) & 1) << 0xe |
                                  auVar64._14_2_ & 0x8000) == 0xffff) goto LAB_00670375;
                      auVar32._4_4_ = uVar54;
                      auVar32._0_4_ = uVar54;
                      auVar32._8_4_ = uVar54;
                      auVar32._12_4_ = uVar54;
                      auVar152 = psubsw(auVar149,auVar32);
                      sVar33 = auVar152._0_2_;
                      auVar149._0_2_ =
                           (ushort)(sVar134 < sVar33) * sVar33 |
                           (ushort)(sVar134 >= sVar33) * sVar134;
                      sVar33 = auVar152._2_2_;
                      auVar149._2_2_ =
                           (ushort)(sVar140 < sVar33) * sVar33 |
                           (ushort)(sVar140 >= sVar33) * sVar140;
                      sVar33 = auVar152._4_2_;
                      auVar149._4_2_ =
                           (ushort)(sVar142 < sVar33) * sVar33 |
                           (ushort)(sVar142 >= sVar33) * sVar142;
                      sVar33 = auVar152._6_2_;
                      auVar149._6_2_ =
                           (ushort)(sVar103 < sVar33) * sVar33 |
                           (ushort)(sVar103 >= sVar33) * sVar103;
                      sVar33 = auVar152._8_2_;
                      auVar149._8_2_ =
                           (ushort)(sVar144 < sVar33) * sVar33 |
                           (ushort)(sVar144 >= sVar33) * sVar144;
                      sVar33 = auVar152._10_2_;
                      auVar149._10_2_ =
                           (ushort)(sVar146 < sVar33) * sVar33 |
                           (ushort)(sVar146 >= sVar33) * sVar146;
                      sVar33 = auVar152._12_2_;
                      auVar149._12_2_ =
                           (ushort)(sVar147 < sVar33) * sVar33 |
                           (ushort)(sVar147 >= sVar33) * sVar147;
                      sVar33 = auVar152._14_2_;
                      auVar149._14_2_ =
                           (ushort)(sVar106 < sVar33) * sVar33 |
                           (ushort)(sVar106 >= sVar33) * sVar106;
                      auVar138 = *(undefined1 (*) [16])((long)*ptr + lVar47);
                      lVar47 = lVar47 + 0x10;
                    } while (lVar44 != lVar47);
                    iVar43 = iVar43 + 1;
                  } while (iVar43 != 8);
LAB_00670375:
                  lVar38 = lVar38 + lVar44;
                  lVar46 = lVar46 + lVar44;
                  palVar35 = ptr_04;
                  uVar40 = uVar1;
                  palVar36 = local_f0;
                  if (uVar1 == uVar61) {
                    uVar61 = ptr_04[(ulong)uVar39 % uVar51][1];
                    if (iVar49 < 7) {
                      iVar43 = 0;
                      uVar51 = ptr_04[(ulong)uVar39 % uVar51][0];
                      do {
                        uVar61 = uVar61 << 0x10 | uVar51 >> 0x30;
                        iVar43 = iVar43 + 1;
                        uVar51 = uVar51 << 0x10;
                      } while (iVar43 < 7 - iVar49);
                    }
                    auVar65._0_2_ = -(ushort)((short)uVar79 < (short)local_88);
                    auVar65._2_2_ = -(ushort)((short)uVar82 < (short)uStack_86);
                    auVar65._4_2_ = -(ushort)((short)uVar83 < (short)local_88);
                    auVar65._6_2_ = -(ushort)((short)uVar85 < (short)uStack_86);
                    auVar65._8_2_ = -(ushort)((short)uVar86 < (short)local_88);
                    auVar65._10_2_ = -(ushort)((short)uVar88 < (short)uStack_86);
                    auVar65._12_2_ = -(ushort)((short)uVar89 < (short)local_88);
                    auVar65._14_2_ = -(ushort)((short)uVar91 < (short)uStack_86);
                    auVar71._0_2_ = -(ushort)((short)local_98 < (short)uVar67);
                    auVar71._2_2_ = -(ushort)((short)uStack_96 < (short)uVar72);
                    auVar71._4_2_ = -(ushort)((short)local_98 < (short)uVar73);
                    auVar71._6_2_ = -(ushort)((short)uStack_96 < (short)uVar74);
                    auVar71._8_2_ = -(ushort)((short)local_98 < (short)uVar75);
                    auVar71._10_2_ = -(ushort)((short)uStack_96 < (short)uVar76);
                    auVar71._12_2_ = -(ushort)((short)local_98 < (short)uVar77);
                    auVar71._14_2_ = -(ushort)((short)uStack_96 < (short)uVar78);
                    auVar71 = auVar71 | auVar65;
                    if ((((((((((((((((auVar71 >> 7 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar71 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar71 >> 0x17 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar71 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar71 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar71 >> 0x2f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar71 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar71 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar71 >> 0x47 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar71 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar71 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar71 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar71 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar71 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar71 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar71[0xf]) {
                      sVar33 = (short)(uVar61 >> 0x30);
                    }
                    else {
                      *(byte *)&ppVar34->flag = (byte)ppVar34->flag | 0x40;
                      sVar33 = 0;
                      iVar42 = 0;
                      uVar39 = 0;
                    }
                    ppVar34->score = (int)sVar33;
                    ppVar34->end_query = uVar39;
                    ppVar34->end_ref = iVar42;
                    parasail_free(ptr_03);
                    parasail_free(ptr_02);
                    parasail_free(ptr_01);
                    parasail_free(local_f0);
                    parasail_free(ptr_00);
                    parasail_free(ptr);
                    parasail_free(ptr_04);
                    return ppVar34;
                  }
                } while( true );
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEaStore = NULL;
    __m128i* restrict pvEaLoad = NULL;
    __m128i* restrict pvHT = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;
    __m128i vTIns;
    __m128i vTDel;
    __m128i vTDiag;
    __m128i vTDiagE;
    __m128i vTInsE;
    __m128i vTDiagF;
    __m128i vTDelF;
    __m128i vTMask;
    __m128i vFTMask;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vTIns  = _mm_set1_epi16(PARASAIL_INS);
    vTDel  = _mm_set1_epi16(PARASAIL_DEL);
    vTDiag = _mm_set1_epi16(PARASAIL_DIAG);
    vTDiagE = _mm_set1_epi16(PARASAIL_DIAG_E);
    vTInsE = _mm_set1_epi16(PARASAIL_INS_E);
    vTDiagF = _mm_set1_epi16(PARASAIL_DIAG_F);
    vTDelF = _mm_set1_epi16(PARASAIL_DEL_F);
    vTMask = _mm_set1_epi16(PARASAIL_ZERO_MASK);
    vFTMask = _mm_set1_epi16(PARASAIL_F_MASK);

    /* initialize result */
    result = parasail_result_new_trace(segLen, s2Len, 16, sizeof(__m128i));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad = parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);
    pvEaStore = parasail_memalign___m128i(16, segLen);
    pvEaLoad = parasail_memalign___m128i(16, segLen);
    pvHT = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEaStore) return NULL;
    if (!pvEaLoad) return NULL;
    if (!pvHT) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            _mm_store_si128(&pvEaStore[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    for (i=0; i<segLen; ++i) {
        arr_store(result->trace->trace_table, vTDiagE, i, segLen, 0);
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFa;
        __m128i vFa_ext;
        __m128i vH;
        __m128i vH_dag;
        const __m128i* vP = NULL;

        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 2);

        /* insert upper boundary condition */
        vH = _mm_insert_epi16(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad, pvHStore)
        SWAP(pvEaLoad, pvEaStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi16(vH_dag, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vF);

            {
                __m128i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                __m128i case1 = _mm_cmpeq_epi16(vH, vH_dag);
                __m128i case2 = _mm_cmpeq_epi16(vH, vF);
                __m128i vT = _mm_blendv_epi8_rpl(
                        _mm_blendv_epi8_rpl(vTIns, vTDel, case2),
                        vTDiag, case1);
                _mm_store_si128(pvHT + i, vT);
                vT = _mm_or_si128(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i, segLen, j);
            }

            vEF_opn = _mm_subs_epi16(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vEF_opn, vE_ext);
            _mm_store_si128(pvE + i, vE);
            {
                __m128i vEa = _mm_load_si128(pvEaLoad + i);
                __m128i vEa_ext = _mm_subs_epi16(vEa, vGapE);
                vEa = _mm_max_epi16(vEF_opn, vEa_ext);
                _mm_store_si128(pvEaStore + i, vEa);
                if (j+1<s2Len) {
                    __m128i cond = _mm_cmpgt_epi16(vEF_opn, vEa_ext);
                    __m128i vT = _mm_blendv_epi8_rpl(vTInsE, vTDiagE, cond);
                    arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                }
            }

            /* Update vF value. */
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vEF_opn, vF_ext);
            if (i+1<segLen) {
                __m128i vTAll = arr_load(result->trace->trace_table, i+1, segLen, j);
                __m128i cond = _mm_cmpgt_epi16(vEF_opn, vF_ext);
                __m128i vT = _mm_blendv_epi8_rpl(vTDelF, vTDiagF, cond);
                vT = _mm_or_si128(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i+1, segLen, j);
            }

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }


        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        vFa_ext = vF_ext;
        vFa = vF;
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            vHp = _mm_slli_si128(vHp, 2);
            vHp = _mm_insert_epi16(vHp, boundary[j], 0);
            vEF_opn = _mm_slli_si128(vEF_opn, 2);
            vEF_opn = _mm_insert_epi16(vEF_opn, tmp2, 0);
            vF_ext = _mm_slli_si128(vF_ext, 2);
            vF_ext = _mm_insert_epi16(vF_ext, NEG_LIMIT, 0);
            vF = _mm_slli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, tmp2, 0);
            vFa_ext = _mm_slli_si128(vFa_ext, 2);
            vFa_ext = _mm_insert_epi16(vFa_ext, NEG_LIMIT, 0);
            vFa = _mm_slli_si128(vFa, 2);
            vFa = _mm_insert_epi16(vFa, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
                {
                    __m128i vTAll;
                    __m128i vT;
                    __m128i case1;
                    __m128i case2;
                    __m128i cond;
                    vHp = _mm_adds_epi16(vHp, _mm_load_si128(vP + i));
                    case1 = _mm_cmpeq_epi16(vH, vHp);
                    case2 = _mm_cmpeq_epi16(vH, vF);
                    cond = _mm_andnot_si128(case1,case2);
                    vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    vT = _mm_load_si128(pvHT + i);
                    vT = _mm_blendv_epi8_rpl(vT, vTDel, cond);
                    _mm_store_si128(pvHT + i, vT);
                    vTAll = _mm_and_si128(vTAll, vTMask);
                    vTAll = _mm_or_si128(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                /* Update vF value. */
                {
                    __m128i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    __m128i cond = _mm_cmpgt_epi16(vEF_opn, vFa_ext);
                    __m128i vT = _mm_blendv_epi8_rpl(vTDelF, vTDiagF, cond);
                    vTAll = _mm_and_si128(vTAll, vFTMask);
                    vTAll = _mm_or_si128(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                vEF_opn = _mm_subs_epi16(vH, vGapO);
                vF_ext = _mm_subs_epi16(vF, vGapE);
                {
                    __m128i vEa = _mm_load_si128(pvEaLoad + i);
                    __m128i vEa_ext = _mm_subs_epi16(vEa, vGapE);
                    vEa = _mm_max_epi16(vEF_opn, vEa_ext);
                    _mm_store_si128(pvEaStore + i, vEa);
                    if (j+1<s2Len) {
                        __m128i cond = _mm_cmpgt_epi16(vEF_opn, vEa_ext);
                        __m128i vT = _mm_blendv_epi8_rpl(vTInsE, vTDiagE, cond);
                        arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                    }
                }
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi16(vF_ext, vEF_opn),
                                _mm_cmpeq_epi16(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi16(vEF_opn, vF_ext);*/
                vF = vF_ext;
                vFa_ext = _mm_subs_epi16(vFa, vGapE);
                vFa = _mm_max_epi16(vEF_opn, vFa_ext);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }
    }

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvHT);
    parasail_free(pvEaLoad);
    parasail_free(pvEaStore);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}